

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

void __thiscall tonk::UDPSocket::AddFirewallRule(UDPSocket *this)

{
  atomic<int> *paVar1;
  element_type *peVar2;
  long *plVar3;
  thread_info_base *this_thread;
  ptr pStack_28;
  
  LOCK();
  paVar1 = &((this->Deps).SocketRefCount)->RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  peVar2 = (this->Deps).Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  plVar3 = (long *)__tls_get_addr();
  pStack_28.v = (void *)0x0;
  pStack_28.p = (executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
                 *)0x0;
  if (*plVar3 == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*plVar3 + 8);
  }
  pStack_28.v = asio::detail::thread_info_base::allocate(this_thread,0x30);
  (((executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     *)pStack_28.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     *)pStack_28.v)->super_scheduler_operation).func_ =
       asio::detail::
       executor_op<asio::detail::work_dispatcher<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     *)pStack_28.v)->super_scheduler_operation).task_result_ = 0;
  (((executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     *)pStack_28.v)->handler_).work_.owns_ = true;
  (((executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
     *)pStack_28.v)->handler_).handler_.this = this;
  pStack_28.p = (executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
                 *)pStack_28.v;
  asio::detail::scheduler::post_immediate_completion(peVar2->impl_,(operation *)pStack_28.v,false);
  pStack_28.v = (void *)0x0;
  pStack_28.p = (executor_op<asio::detail::work_dispatcher<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseUDP_cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
                 *)0x0;
  asio::detail::
  executor_op<asio::detail::work_dispatcher<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseUDP.cpp:245:31)>,_asio::detail::recycling_allocator<void>,_asio::detail::scheduler_operation>
  ::ptr::reset(&pStack_28);
  return;
}

Assistant:

void UDPSocket::AddFirewallRule()
{
    // Add firewall rule from a background thread
    Deps.SocketRefCount->IncrementReferences();
    asio::post(*Deps.Context, [this]()
    {
        Firewall_AddPort(LocalBoundPort);
        Deps.SocketRefCount->DecrementReferences();
    });
}